

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O0

void json_append_string(lua_State *l,strbuf_t *json,int lindex)

{
  ulong local_40;
  size_t i;
  size_t len;
  char *str;
  char *escstr;
  strbuf_t *psStack_18;
  int lindex_local;
  strbuf_t *json_local;
  lua_State *l_local;
  
  escstr._4_4_ = lindex;
  psStack_18 = json;
  json_local = (strbuf_t *)l;
  len = (size_t)lua_tolstring(l,lindex,&i);
  strbuf_ensure_empty_length(psStack_18,(int)i * 6 + 2);
  strbuf_append_char_unsafe(psStack_18,'\"');
  for (local_40 = 0; local_40 < i; local_40 = local_40 + 1) {
    str = char2escape[*(byte *)(len + local_40)];
    if (str == (char *)0x0) {
      strbuf_append_char_unsafe(psStack_18,*(char *)(len + local_40));
    }
    else {
      strbuf_append_string(psStack_18,str);
    }
  }
  strbuf_append_char_unsafe(psStack_18,'\"');
  return;
}

Assistant:

static void json_append_string(lua_State *l, strbuf_t *json, int lindex)
{
    const char *escstr;
    const char *str;
    size_t len;
    size_t i;

    str = lua_tolstring(l, lindex, &len);

    /* Worst case is len * 6 (all unicode escapes).
     * This buffer is reused constantly for small strings
     * If there are any excess pages, they won't be hit anyway.
     * This gains ~5% speedup. */
    strbuf_ensure_empty_length(json, len * 6 + 2);

    strbuf_append_char_unsafe(json, '\"');
    for (i = 0; i < len; i++) {
        escstr = char2escape[(unsigned char)str[i]];
        if (escstr)
            strbuf_append_string(json, escstr);
        else
            strbuf_append_char_unsafe(json, str[i]);
    }
    strbuf_append_char_unsafe(json, '\"');
}